

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

Vec_Wrd_t * Vec_WrdUniqifyHash(Vec_Wrd_t *vData,int nWordSize)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *__s;
  void *__s_00;
  void *__ptr;
  long lVar5;
  Vec_Wrd_t *p;
  word *pwVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  size_t __size;
  
  iVar2 = vData->nSize;
  uVar13 = (ulong)iVar2;
  vData->nCap = vData->nCap << 1;
  vData->nSize = iVar2 * 2;
  iVar7 = iVar2;
  if (1 < uVar13) {
    uVar4 = iVar2 - 1;
    if (uVar4 == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      iVar7 = iVar7 + 0x21;
    }
  }
  iVar7 = 1 << ((byte)iVar7 & 0x1f);
  __size = (long)iVar7 << 2;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  __ptr = malloc(uVar13 * 4);
  if (iVar2 < 1) {
    iVar10 = 0;
  }
  else {
    lVar5 = 0;
    uVar9 = 0;
    iVar10 = 0;
    do {
      uVar4 = vData->nSize;
      if ((long)(int)uVar4 <= (long)(uVar9 * 2)) goto LAB_007680c8;
      pwVar6 = vData->pArray;
      lVar12 = 0;
      uVar8 = 0;
      do {
        bVar1 = *(byte *)((long)pwVar6 + lVar12 + lVar5);
        uVar8 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes + (ulong)(bVar1 >> 4) * 4) *
                (&DAT_00a2e774)[lVar12 * 2] +
                *(int *)(Vec_IntUniqueHashKey_s_BigPrimes + (ulong)(bVar1 & 0xf) * 4) *
                (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar12 * 2] + uVar8;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      lVar12 = (long)(int)(uVar8 & iVar7 - 1U);
      piVar11 = (int *)((long)__s + lVar12 * 4);
      for (uVar8 = *(uint *)((long)__s + lVar12 * 4); uVar8 != 0xffffffff;
          uVar8 = *(uint *)((long)__s_00 + (ulong)uVar8 * 4)) {
        if (((int)uVar8 < 0) ||
           (uVar3 = uVar8 * 2,
           uVar4 == uVar3 || SBORROW4(uVar4,uVar3) != (int)(uVar4 + uVar8 * -2) < 0))
        goto LAB_007680c8;
        if (pwVar6[uVar9] == *(word *)((long)pwVar6 + (ulong)uVar3 * 4)) break;
        piVar11 = (int *)((long)__s_00 + (ulong)uVar8 * 4);
      }
      if (*piVar11 == -1) {
        *piVar11 = (int)uVar9;
        iVar10 = iVar10 + 1;
      }
      *(int *)((long)__ptr + uVar9 * 4) = *piVar11;
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar9 != uVar13);
    iVar10 = iVar10 * 2;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar7 = iVar10;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar6 = (word *)0x0;
  }
  else {
    pwVar6 = (word *)malloc((long)iVar7 << 2);
  }
  p->pArray = pwVar6;
  if (0 < iVar2) {
    lVar5 = 0;
    uVar9 = 0;
    do {
      uVar4 = *(uint *)((long)__ptr + uVar9 * 4);
      if ((long)uVar9 <= (long)(int)uVar4) {
        if (uVar9 != uVar4) {
          __assert_fail("Ent == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x64a,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
        }
        if ((long)vData->nSize <= (long)(uVar9 * 2)) {
LAB_007680c8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        pwVar6 = vData->pArray;
        lVar12 = 0;
        do {
          Vec_IntPush((Vec_Int_t *)p,*(int *)((long)pwVar6 + lVar12 * 4 + lVar5));
          lVar12 = lVar12 + 1;
        } while (lVar12 == 1);
      }
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar9 != uVar13);
  }
  iVar2 = p->nSize;
  if (iVar2 == iVar10) {
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    vData->nSize = vData->nSize / 2;
    vData->nCap = vData->nCap / 2;
    p->nSize = iVar2 / 2;
    p->nCap = p->nCap / 2;
    return p;
  }
  __assert_fail("Vec_IntSize(vUnique) == nUnique * nIntSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x64d,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdUniqifyHash( Vec_Wrd_t * vData, int nWordSize )
{
    Vec_Int_t * vResInt;
    Vec_Int_t * vDataInt = (Vec_Int_t *)vData;
    vDataInt->nSize *= 2;
    vDataInt->nCap *= 2;
    vResInt = Vec_IntUniqifyHash( vDataInt, 2 * nWordSize );
    vDataInt->nSize /= 2;
    vDataInt->nCap /= 2;
    vResInt->nSize /= 2;
    vResInt->nCap /= 2;
    return (Vec_Wrd_t *)vResInt;
}